

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_mv_pred.c
# Opt level: O0

void ihevcd_scale_collocated_mv
               (mv_t *ps_mv,WORD32 cur_ref_poc,WORD32 col_ref_poc,WORD32 col_poc,WORD32 cur_poc)

{
  int iVar1;
  int iVar2;
  int local_60;
  WORD16 local_5c;
  int local_58;
  WORD16 local_54;
  uint local_50;
  uint local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  WORD32 mvy;
  WORD32 mvx;
  WORD32 dist_scale_factor;
  WORD32 tx;
  WORD32 tb;
  WORD32 td;
  WORD32 cur_poc_local;
  WORD32 col_poc_local;
  WORD32 col_ref_poc_local;
  WORD32 cur_ref_poc_local;
  mv_t *ps_mv_local;
  
  if (col_poc - col_ref_poc < 0x80) {
    if (col_poc - col_ref_poc < -0x80) {
      local_38 = -0x80;
    }
    else {
      local_38 = col_poc - col_ref_poc;
    }
    local_34 = local_38;
  }
  else {
    local_34 = 0x7f;
  }
  if (cur_poc - cur_ref_poc < 0x80) {
    if (cur_poc - cur_ref_poc < -0x80) {
      local_40 = -0x80;
    }
    else {
      local_40 = cur_poc - cur_ref_poc;
    }
    local_3c = local_40;
  }
  else {
    local_3c = 0x7f;
  }
  iVar1 = local_34;
  if (local_34 < 1) {
    iVar1 = -local_34;
  }
  local_48 = local_3c * (((iVar1 >> 1) + 0x4000) / local_34) + 0x20 >> 6;
  if (local_48 < 0x1000) {
    if (local_48 < -0x1000) {
      local_48 = -0x1000;
    }
    local_44 = local_48;
  }
  else {
    local_44 = 0xfff;
  }
  iVar1 = (int)ps_mv->i2_mvx;
  iVar2 = (int)ps_mv->i2_mvy;
  if (local_44 * iVar1 < 0) {
    local_4c = 0xffffffff;
  }
  else {
    local_4c = (uint)(0 < local_44 * iVar1);
  }
  iVar1 = local_44 * iVar1;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  local_58 = local_4c * (iVar1 + 0x7f >> 8);
  if (local_44 * iVar2 < 0) {
    local_50 = 0xffffffff;
  }
  else {
    local_50 = (uint)(0 < local_44 * iVar2);
  }
  local_44 = local_44 * iVar2;
  if (local_44 < 1) {
    local_44 = -local_44;
  }
  local_60 = local_50 * (local_44 + 0x7f >> 8);
  if (local_58 < 0x8000) {
    if (local_58 < -0x8000) {
      local_58 = -0x8000;
    }
    local_54 = (WORD16)local_58;
  }
  else {
    local_54 = 0x7fff;
  }
  ps_mv->i2_mvx = local_54;
  if (local_60 < 0x8000) {
    if (local_60 < -0x8000) {
      local_60 = -0x8000;
    }
    local_5c = (WORD16)local_60;
  }
  else {
    local_5c = 0x7fff;
  }
  ps_mv->i2_mvy = local_5c;
  return;
}

Assistant:

void ihevcd_scale_collocated_mv(mv_t *ps_mv,
                                WORD32 cur_ref_poc,
                                WORD32 col_ref_poc,
                                WORD32 col_poc,
                                WORD32 cur_poc)
{
    WORD32 td, tb, tx;
    WORD32 dist_scale_factor;
    WORD32 mvx, mvy;

    td = CLIP_S8(col_poc - col_ref_poc);
    tb = CLIP_S8(cur_poc - cur_ref_poc);

    tx = (16384 + (abs(td) >> 1)) / td;

    dist_scale_factor = (tb * tx + 32) >> 6;
    dist_scale_factor = CLIP3(dist_scale_factor, -4096, 4095);

    mvx = ps_mv->i2_mvx;
    mvy = ps_mv->i2_mvy;

    mvx = SIGN(dist_scale_factor * mvx)
                    * ((abs(dist_scale_factor * mvx) + 127) >> 8);
    mvy = SIGN(dist_scale_factor * mvy)
                    * ((abs(dist_scale_factor * mvy) + 127) >> 8);

    ps_mv->i2_mvx = CLIP_S16(mvx);
    ps_mv->i2_mvy = CLIP_S16(mvy);
}